

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::set_piece_deadline
          (torrent *this,piece_index_t piece,int t,deadline_flags_t flags)

{
  int *piVar1;
  vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  *this_00;
  element_type *peVar2;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_01;
  pointer ptVar3;
  pointer ptVar4;
  _func_int *p_Var5;
  rep rVar6;
  rep rVar7;
  undefined8 uVar8;
  rep rVar9;
  rep rVar10;
  undefined8 uVar11;
  long *plVar12;
  deadline_flags_t dVar13;
  undefined3 uVar14;
  bool bVar15;
  download_priority_t dVar16;
  bool bVar17;
  int iVar18;
  difference_type __d;
  time_point tVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  pointer ptVar23;
  char *pcVar24;
  const_iterator __position;
  long lVar25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  time_critical_piece p;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  downloaders;
  downloading_piece pi;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_7c;
  undefined1 local_78 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> local_50
  ;
  piece_block local_34;
  downloading_piece local_2c;
  
  local_7c.m_val = piece.m_val;
  if (((((this->super_torrent_hot_members).field_0x4b & 4) == 0) &&
      (peVar2 = (this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      -1 < piece.m_val && 0 < (peVar2->m_files).m_piece_length)) &&
     (piece.m_val < (peVar2->m_files).m_num_pieces)) {
    tVar19 = time_now();
    bVar15 = is_seed(this);
    if ((bVar15) ||
       ((this_01._M_head_impl =
              (this->super_torrent_hot_members).m_picker._M_t.
              super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
        this_01._M_head_impl != (piece_picker *)0x0 &&
        (bVar15 = piece_picker::has_piece_passed(this_01._M_head_impl,(piece_index_t)local_7c.m_val)
        , bVar15)))) {
      if ((flags.m_val & 1) != 0) {
        read_piece(this,(piece_index_t)local_7c.m_val);
        return;
      }
    }
    else {
      if ((this->m_time_critical_pieces).
          super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->m_time_critical_pieces).
          super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_78,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[7])();
        local_50.
        super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT71(local_78._9_7_,local_78[8]);
        local_50.
        super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
        pcVar24 = (char *)local_78._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_50.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pcVar24 = &__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_50.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_50.
                 super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_50.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_50.
                 super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
          }
        }
        boost::asio::
        post<boost::asio::io_context,libtorrent::aux::torrent::set_piece_deadline(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::deadline_flags_tag,void>)::__0>
                  ((io_context *)CONCAT44(extraout_var_00,iVar18),(type *)&local_50,pcVar24);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_50.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_50.
                     super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_78._9_7_,local_78[8]) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71(local_78._9_7_,local_78[8]));
        }
      }
      lVar25 = (long)tVar19.__d.__r + (long)t * 1000000;
      this_00 = &this->m_time_critical_pieces;
      ptVar3 = (this->m_time_critical_pieces).
               super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ptVar4 = (this->m_time_critical_pieces).
               super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ptVar3 != ptVar4) {
        while (ptVar23 = ptVar3 + 1, (ptVar3->piece).m_val != local_7c.m_val) {
          ptVar3 = ptVar23;
          if (ptVar23 == ptVar4) goto LAB_00329074;
        }
        (ptVar3->deadline).__d.__r = lVar25;
        (ptVar3->flags).m_val = flags.m_val;
        while ((ptVar23 !=
                (this->m_time_critical_pieces).
                super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                ._M_impl.super__Vector_impl_data._M_finish &&
               ((ptVar23->deadline).__d.__r < ptVar23[-1].deadline.__d.__r))) {
          local_58._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&ptVar23[-1].piece;
          local_78._0_8_ = ptVar23[-1].first_requested.__d.__r;
          rVar6 = ptVar23[-1].last_requested.__d.__r;
          rVar7 = ptVar23[-1].deadline.__d.__r;
          uVar8._0_1_ = ptVar23[-1].flags;
          uVar8._1_3_ = *(undefined3 *)&ptVar23[-1].field_0x19;
          uVar8._4_4_ = ptVar23[-1].peers;
          local_78[0x10] = (undefined1)rVar7;
          local_78._17_7_ = (undefined7)((ulong)rVar7 >> 8);
          local_78._24_4_ = (undefined4)uVar8;
          local_78[8] = (undefined1)rVar6;
          local_78._9_7_ = (undefined7)((ulong)rVar6 >> 8);
          ptVar23[-1].piece.m_val = (ptVar23->piece).m_val;
          rVar9 = (ptVar23->first_requested).__d.__r;
          rVar10 = (ptVar23->last_requested).__d.__r;
          dVar13.m_val = (ptVar23->flags).m_val;
          uVar14 = *(undefined3 *)&ptVar23->field_0x19;
          iVar18 = ptVar23->peers;
          ptVar23[-1].deadline.__d.__r = (ptVar23->deadline).__d.__r;
          ptVar23[-1].flags = (deadline_flags_t)dVar13.m_val;
          *(undefined3 *)&ptVar23[-1].field_0x19 = uVar14;
          ptVar23[-1].peers = iVar18;
          ptVar23[-1].first_requested.__d.__r = rVar9;
          ptVar23[-1].last_requested.__d.__r = rVar10;
          (ptVar23->piece).m_val = local_58._M_pi._0_4_;
          (ptVar23->deadline).__d.__r = rVar7;
          ptVar23->flags = (deadline_flags_t)(undefined1)uVar8;
          *(undefined3 *)&ptVar23->field_0x19 = uVar8._1_3_;
          ptVar23->peers = uVar8._4_4_;
          (ptVar23->first_requested).__d.__r = local_78._0_8_;
          (ptVar23->last_requested).__d.__r = rVar6;
          ptVar23 = ptVar23 + 1;
          local_78._28_4_ = uVar8._4_4_;
        }
        ptVar23 = ptVar23 + -1;
        if (ptVar23 !=
            (this_00->
            super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          do {
            if (ptVar23[-1].deadline.__d.__r <= (ptVar23->deadline).__d.__r) break;
            local_58._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&ptVar23->piece;
            local_78._0_8_ = (ptVar23->first_requested).__d.__r;
            rVar6 = (ptVar23->last_requested).__d.__r;
            rVar7 = (ptVar23->deadline).__d.__r;
            uVar11._0_1_ = ptVar23->flags;
            uVar11._1_3_ = *(undefined3 *)&ptVar23->field_0x19;
            uVar11._4_4_ = ptVar23->peers;
            local_78[0x10] = (undefined1)rVar7;
            local_78._17_7_ = (undefined7)((ulong)rVar7 >> 8);
            local_78._24_4_ = (undefined4)uVar11;
            local_78[8] = (undefined1)rVar6;
            local_78._9_7_ = (undefined7)((ulong)rVar6 >> 8);
            rVar9 = ptVar23[-1].last_requested.__d.__r;
            rVar10 = ptVar23[-1].deadline.__d.__r;
            dVar13.m_val = ptVar23[-1].flags.m_val;
            uVar14 = *(undefined3 *)&ptVar23[-1].field_0x19;
            iVar18 = ptVar23[-1].peers;
            (ptVar23->first_requested).__d.__r = ptVar23[-1].first_requested.__d.__r;
            (ptVar23->last_requested).__d.__r = rVar9;
            (ptVar23->deadline).__d.__r = rVar10;
            ptVar23->flags = (deadline_flags_t)dVar13.m_val;
            *(undefined3 *)&ptVar23->field_0x19 = uVar14;
            ptVar23->peers = iVar18;
            (ptVar23->piece).m_val = ptVar23[-1].piece.m_val;
            ptVar23[-1].first_requested.__d.__r = local_78._0_8_;
            ptVar23[-1].last_requested.__d.__r = rVar6;
            ptVar23[-1].deadline.__d.__r = rVar7;
            ptVar23[-1].flags = (deadline_flags_t)(undefined1)uVar11;
            *(undefined3 *)&ptVar23[-1].field_0x19 = uVar11._1_3_;
            ptVar23[-1].peers = uVar11._4_4_;
            ptVar23[-1].piece.m_val = local_58._M_pi._0_4_;
            ptVar23 = ptVar23 + -1;
            local_78._28_4_ = uVar11._4_4_;
          } while (ptVar23 !=
                   (this_00->
                   super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                   )._M_impl.super__Vector_impl_data._M_start);
        }
        dVar16 = piece_picker::piece_priority
                           ((this->super_torrent_hot_members).m_picker._M_t.
                            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                            _M_head_impl,(piece_index_t)local_7c.m_val);
        bVar15 = is_finished(this);
        bVar17 = piece_picker::set_piece_priority
                           ((this->super_torrent_hot_members).m_picker._M_t.
                            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                            _M_head_impl,(piece_index_t)local_7c.m_val,(download_priority_t)0x7);
        if (dVar16.m_val != '\0') {
          return;
        }
        update_gauge(this);
        if (!bVar17) {
          return;
        }
        update_peer_interest(this,bVar15);
        return;
      }
LAB_00329074:
      need_picker(this);
      local_78._0_8_ = -0x8000000000000000;
      local_78[8] = 0;
      local_78._9_7_ = 0x80000000000000;
      local_78._25_3_ = SUB43(local_78._24_4_,1);
      local_78[0x18] = flags.m_val;
      local_78[0x10] = (undefined1)lVar25;
      local_78._17_7_ = (undefined7)((ulong)lVar25 >> 8);
      local_78._28_4_ = 0;
      local_58._M_pi._0_4_ = local_7c.m_val;
      __position._M_current =
           (this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_start;
      uVar20 = (long)(this->m_time_critical_pieces).
                     super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current;
      if (0 < (long)uVar20) {
        uVar20 = (uVar20 >> 3) * -0x3333333333333333;
        do {
          uVar21 = uVar20 >> 1;
          uVar22 = uVar21;
          if (__position._M_current[uVar21].deadline.__d.__r <= lVar25) {
            uVar22 = ~uVar21 + uVar20;
            __position._M_current = __position._M_current + uVar21 + 1;
          }
          uVar20 = uVar22;
        } while (0 < (long)uVar22);
      }
      ::std::
      vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
      ::insert(this_00,__position,(value_type *)local_78);
      dVar16 = piece_picker::piece_priority
                         ((this->super_torrent_hot_members).m_picker._M_t.
                          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                          _M_head_impl,(piece_index_t)local_7c.m_val);
      bVar15 = is_finished(this);
      bVar17 = piece_picker::set_piece_priority
                         ((this->super_torrent_hot_members).m_picker._M_t.
                          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                          _M_head_impl,(piece_index_t)local_7c.m_val,(download_priority_t)0x7);
      if ((dVar16.m_val == '\0') && (update_gauge(this), bVar17)) {
        update_peer_interest(this,bVar15);
      }
      local_2c.index.m_val = 0x7fffffff;
      local_2c.info_idx = 0xffff;
      local_2c._6_4_ = 0;
      local_2c._10_2_ = 0;
      piece_picker::piece_info
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                 (piece_index_t)local_7c.m_val,&local_2c);
      if ((local_2c._10_2_ & 0x7fff) != 0) {
        piece_picker::get_downloaders
                  (&local_50,
                   (this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                   (piece_index_t)local_7c.m_val);
        if (local_50.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_50.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar18 = 0;
          p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_50.
                    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if ((p_Var26->_vptr__Sp_counted_base != (_func_int **)0x0) &&
               (p_Var5 = p_Var26->_vptr__Sp_counted_base[1], p_Var5 != (_func_int *)0x0)) {
              local_34.piece_index.m_val = local_7c.m_val;
              local_34.block_index = iVar18;
              peer_connection::make_time_critical((peer_connection *)(p_Var5 + -0x80),&local_34);
            }
            p_Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var26->_M_use_count;
            iVar18 = iVar18 + 1;
          } while (p_Var26 !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_50.
                   super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_50.
            super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator_delete(local_50.
                          super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_50.
                                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.
                                super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
  }
  else if ((flags.m_val & 1) != 0) {
    iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_78);
    local_50.
    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT35(local_50.
                           super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._5_3_,0x10000007d);
    local_50.
    super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)&boost::system::detail::cat_holder<void>::generic_category_instance;
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
              ((alert_manager *)CONCAT44(extraout_var,iVar18),(torrent_handle *)local_78,&local_7c,
               (error_code *)&local_50);
    plVar12 = (long *)CONCAT71(local_78._9_7_,local_78[8]);
    if (plVar12 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)plVar12 + 0xc);
        iVar18 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar18 = *(int *)((long)plVar12 + 0xc);
        *(int *)((long)plVar12 + 0xc) = iVar18 + -1;
      }
      if (iVar18 == 1) {
        (**(code **)(*plVar12 + 0x18))();
      }
    }
  }
  return;
}

Assistant:

void torrent::set_piece_deadline(piece_index_t const piece, int const t
		, deadline_flags_t const flags)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT_PRECOND(piece >= piece_index_t(0));
		TORRENT_ASSERT_PRECOND(valid_metadata());
		TORRENT_ASSERT_PRECOND(valid_metadata() && piece < m_torrent_file->end_piece());

		if (m_abort || !valid_metadata()
			|| piece < piece_index_t(0)
			|| piece >= m_torrent_file->end_piece())
		{
			// failed
			if (flags & torrent_handle::alert_when_available)
			{
				m_ses.alerts().emplace_alert<read_piece_alert>(
					get_handle(), piece, error_code(boost::system::errc::operation_canceled, generic_category()));
			}
			return;
		}

		time_point const deadline = aux::time_now() + milliseconds(t);

		// if we already have the piece, no need to set the deadline.
		// however, if the user asked to get the piece data back, we still
		// need to read it and post it back to the user
		if (is_seed() || (has_picker() && m_picker->has_piece_passed(piece)))
		{
			if (flags & torrent_handle::alert_when_available)
				read_piece(piece);
			return;
		}

		// if this is the first time critical piece we add. in order to make it
		// react quickly, cancel all the currently outstanding requests
		if (m_time_critical_pieces.empty())
		{
			// defer this by posting it to the end of the message queue.
			// this gives the client a chance to specify multiple time-critical
			// pieces before libtorrent cancels requests
			auto self = shared_from_this();
			post(m_ses.get_context(), [self] { self->wrap(&torrent::cancel_non_critical); });
		}

		for (auto i = m_time_critical_pieces.begin()
			, end(m_time_critical_pieces.end()); i != end; ++i)
		{
			if (i->piece != piece) continue;
			i->deadline = deadline;
			i->flags = flags;

			// resort i since deadline might have changed
			while (std::next(i) != m_time_critical_pieces.end() && i->deadline > std::next(i)->deadline)
			{
				std::iter_swap(i, std::next(i));
				++i;
			}
			while (i != m_time_critical_pieces.begin() && i->deadline < std::prev(i)->deadline)
			{
				std::iter_swap(i, std::prev(i));
				--i;
			}
			// just in case this piece had priority 0
			download_priority_t const prev_prio = m_picker->piece_priority(piece);
			bool const was_finished = is_finished();
			bool const filter_updated = m_picker->set_piece_priority(piece, top_priority);
			if (prev_prio == dont_download)
			{
				update_gauge();
				if (filter_updated) update_peer_interest(was_finished);
			}
			return;
		}

		need_picker();

		time_critical_piece p;
		p.first_requested = min_time();
		p.last_requested = min_time();
		p.flags = flags;
		p.deadline = deadline;
		p.peers = 0;
		p.piece = piece;
		auto const critical_piece_it = std::upper_bound(m_time_critical_pieces.begin()
			, m_time_critical_pieces.end(), p);
		m_time_critical_pieces.insert(critical_piece_it, p);

		// just in case this piece had priority 0
		download_priority_t const prev_prio = m_picker->piece_priority(piece);
		bool const was_finished = is_finished();
		bool const filter_updated = m_picker->set_piece_priority(piece, top_priority);
		if (prev_prio == dont_download)
		{
			update_gauge();
			if (filter_updated) update_peer_interest(was_finished);
		}

		piece_picker::downloading_piece pi;
		m_picker->piece_info(piece, pi);
		if (pi.requested == 0) return;
		// this means we have outstanding requests (or queued
		// up requests that haven't been sent yet). Promote them
		// to deadline pieces immediately
		std::vector<torrent_peer*> const downloaders
			= m_picker->get_downloaders(piece);

		int block = 0;
		for (auto i = downloaders.begin()
			, end(downloaders.end()); i != end; ++i, ++block)
		{
			torrent_peer* const tp = *i;
			if (tp == nullptr || tp->connection == nullptr) continue;
			auto* peer = static_cast<peer_connection*>(tp->connection);
			peer->make_time_critical(piece_block(piece, block));
		}
	}